

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::clear(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
        *this)

{
  iterator pos;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  local_50;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_50.m_ = this->elements_;
  InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::SearchFrom(&local_50,(local_50.m_)->index_of_first_non_null_);
  while( true ) {
    local_38 = local_50.node_._0_4_;
    uStack_34 = local_50.node_._4_4_;
    if (CONCAT44(local_50.node_._4_4_,local_50.node_._0_4_) == 0) break;
    pos.it_.node_._4_4_ = local_50.node_._4_4_;
    pos.it_.node_._0_4_ = local_50.node_._0_4_;
    pos.it_.m_._4_4_ = local_50.m_._4_4_;
    pos.it_.m_._0_4_ = local_50.m_._0_4_;
    pos.it_.bucket_index_ = local_50.bucket_index_;
    uStack_30 = local_50.m_._0_4_;
    uStack_2c = local_50.m_._4_4_;
    erase((iterator *)&local_50,this,pos);
  }
  return;
}

Assistant:

void clear() { erase(begin(), end()); }